

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlFreeDocElementContent(xmlDocPtr doc,xmlElementContentPtr cur)

{
  xmlDictPtr pxVar1;
  int iVar2;
  bool bVar3;
  xmlDictPtr local_40;
  xmlElementContentPtr parent;
  size_t depth;
  xmlDictPtr dict;
  xmlElementContentPtr cur_local;
  xmlDocPtr doc_local;
  
  depth = 0;
  parent = (xmlElementContentPtr)0x0;
  if (cur != (xmlElementContentPtr)0x0) {
    dict = (xmlDictPtr)cur;
    if (doc != (xmlDocPtr)0x0) {
      depth = (size_t)doc->dict;
      dict = (xmlDictPtr)cur;
    }
    while( true ) {
      while( true ) {
        bVar3 = true;
        if (dict->size == 0) {
          bVar3 = *(long *)&dict->nbElems != 0;
        }
        if (!bVar3) break;
        if (dict->size == 0) {
          local_40 = *(xmlDictPtr *)&dict->nbElems;
        }
        else {
          local_40 = (xmlDictPtr)dict->size;
        }
        parent = (xmlElementContentPtr)((long)&parent->type + 1);
        dict = local_40;
      }
      if (2 < dict->ref_counter - 1U && dict->ref_counter != 4) {
        xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "Internal: ELEMENT content corrupted invalid type\n",(char *)0x0);
        return;
      }
      if (depth == 0) {
        if (dict->dict != (_xmlDictEntry *)0x0) {
          (*xmlFree)(dict->dict);
        }
        if (dict->subdict != (_xmlDict *)0x0) {
          (*xmlFree)(dict->subdict);
        }
      }
      else {
        if ((dict->dict != (_xmlDictEntry *)0x0) &&
           (iVar2 = xmlDictOwns((xmlDictPtr)depth,(xmlChar *)dict->dict), iVar2 == 0)) {
          (*xmlFree)(dict->dict);
        }
        if ((dict->subdict != (_xmlDict *)0x0) &&
           (iVar2 = xmlDictOwns((xmlDictPtr)depth,(xmlChar *)dict->subdict), iVar2 == 0)) {
          (*xmlFree)(dict->subdict);
        }
      }
      pxVar1 = (xmlDictPtr)dict->strings;
      if ((parent == (xmlElementContentPtr)0x0) || (pxVar1 == (xmlDictPtr)0x0)) break;
      if (dict == (xmlDictPtr)pxVar1->size) {
        pxVar1->size = 0;
      }
      else {
        *(size_t *)&pxVar1->nbElems = 0;
      }
      (*xmlFree)(dict);
      if (*(size_t *)&pxVar1->nbElems == 0) {
        parent = (xmlElementContentPtr)((long)&parent[-1].prefix + 7);
        dict = pxVar1;
      }
      else {
        dict = *(xmlDictPtr *)&pxVar1->nbElems;
      }
    }
    (*xmlFree)(dict);
  }
  return;
}

Assistant:

void
xmlFreeDocElementContent(xmlDocPtr doc, xmlElementContentPtr cur) {
    xmlDictPtr dict = NULL;
    size_t depth = 0;

    if (cur == NULL)
        return;
    if (doc != NULL)
        dict = doc->dict;

    while (1) {
        xmlElementContentPtr parent;

        while ((cur->c1 != NULL) || (cur->c2 != NULL)) {
            cur = (cur->c1 != NULL) ? cur->c1 : cur->c2;
            depth += 1;
        }

	switch (cur->type) {
	    case XML_ELEMENT_CONTENT_PCDATA:
	    case XML_ELEMENT_CONTENT_ELEMENT:
	    case XML_ELEMENT_CONTENT_SEQ:
	    case XML_ELEMENT_CONTENT_OR:
		break;
	    default:
		xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"Internal: ELEMENT content corrupted invalid type\n",
			NULL);
		return;
	}
	if (dict) {
	    if ((cur->name != NULL) && (!xmlDictOwns(dict, cur->name)))
	        xmlFree((xmlChar *) cur->name);
	    if ((cur->prefix != NULL) && (!xmlDictOwns(dict, cur->prefix)))
	        xmlFree((xmlChar *) cur->prefix);
	} else {
	    if (cur->name != NULL) xmlFree((xmlChar *) cur->name);
	    if (cur->prefix != NULL) xmlFree((xmlChar *) cur->prefix);
	}
        parent = cur->parent;
        if ((depth == 0) || (parent == NULL)) {
            xmlFree(cur);
            break;
        }
        if (cur == parent->c1)
            parent->c1 = NULL;
        else
            parent->c2 = NULL;
	xmlFree(cur);

        if (parent->c2 != NULL) {
	    cur = parent->c2;
        } else {
            depth -= 1;
            cur = parent;
        }
    }
}